

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextRecord.test.cpp
# Opt level: O2

void verifyChunk(TextRecord *chunk)

{
  bool bVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  ITransientExpression local_a0;
  char *local_90;
  char *local_88;
  undefined8 local_80;
  TextRecord *local_78;
  AssertionHandler catchAssertionHandler;
  
  local_a0._vptr_ITransientExpression = (_func_int **)0x1733ac;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x54;
  capturedExpression.m_start =
       "\"The new R-matrix analysis of the N-N system on which the ENDF/B-  \" == chunk.text()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_a0,capturedExpression,
             ContinueOnFailure);
  bVar1 = std::operator==("The new R-matrix analysis of the N-N system on which the ENDF/B-  ",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chunk
                         );
  local_a0.m_result = bVar1;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b64f0;
  local_90 = "The new R-matrix analysis of the N-N system on which the ENDF/B-  ";
  local_88 = "==";
  local_80 = 2;
  local_78 = chunk;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a0._vptr_ITransientExpression = (_func_int **)0x1733ac;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0xf;
  capturedExpression_00.m_start = "1 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&local_a0,capturedExpression_00,
             ContinueOnFailure);
  local_a0._8_2_ = 0x101;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b6530;
  local_a0._12_4_ = 1;
  local_90 = "==";
  local_88 = (char *)0x2;
  local_80 = 1;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const TextRecord& chunk ) {

  CHECK( "The new R-matrix analysis of the N-N system on which the ENDF/B-  " == chunk.text() );
  CHECK( 1 == chunk.NC() );
}